

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_client_db.c
# Opt level: O1

pcp_flow_t * pcp_get_flow(flow_key_data *fkd,pcp_server_t *s)

{
  uint32_t uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  pcp_flow_t *ppVar5;
  
  if (s != (pcp_server_t *)0x0 && fkd != (flow_key_data *)0x0) {
    uVar4 = 0;
    if (s->ctx == (pcp_ctx_t *)0x0) {
      return (pcp_flow_t *)0x0;
    }
    uVar1 = s->index;
    lVar3 = 0x4c;
    do {
      uVar4 = (uint)*(byte *)((long)(fkd->nonce).n + lVar3 + -0x29) ^ (uVar4 << 8 | uVar4 >> 0x18);
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    for (ppVar5 = (s->ctx->pcp_db).flows[uVar4 * -0x61c88647 >> 0x1b]; ppVar5 != (pcp_flow_t *)0x0;
        ppVar5 = ppVar5->next) {
      if ((ppVar5->pcp_server_indx == uVar1) && (iVar2 = bcmp(fkd,&ppVar5->kd,0x4c), iVar2 == 0)) {
        return ppVar5;
      }
    }
  }
  return (pcp_flow_t *)0x0;
}

Assistant:

pcp_flow_t *pcp_get_flow(struct flow_key_data *fkd, pcp_server_t *s) {
    pcp_flow_t **fdb;
    uint32_t bucket;
    uint32_t pcp_server_index;

    if ((!fkd) || (!s) || (!s->ctx)) {
        return NULL;
    }
    pcp_server_index = s->index;

    bucket = compute_flow_key(fkd);
    PCP_LOG(PCP_LOGLVL_DEBUG, "Computed key_bucket %d", bucket);
    for (fdb = &s->ctx->pcp_db.flows[bucket]; (*fdb) != NULL;
         fdb = &(*fdb)->next) {
        if (((*fdb)->pcp_server_indx == pcp_server_index) &&
            (0 == memcmp(fkd, &(*fdb)->kd, sizeof(*fkd)))) {
            return *fdb;
        }
    }

    return NULL;
}